

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QAbstractItemViewPrivate * __thiscall
QAbstractItemViewPrivate::renderToPixmap
          (QAbstractItemViewPrivate *this,QModelIndexList *indexes,QRect *r)

{
  QModelIndex *pQVar1;
  ulong uVar2;
  QWindow *pQVar3;
  long *plVar4;
  QRect *in_RCX;
  int j;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  qreal c;
  QPoint local_138;
  QPainter painter;
  QArrayDataPointer<QItemViewPaintPair> local_128;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (indexes->d).ptr;
  local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d._0_4_ = 0xaaaaaaaa;
  local_128.d._4_4_ = 0xaaaaaaaa;
  local_128.ptr._0_4_ = 0xaaaaaaaa;
  local_128.ptr._4_4_ = 0xaaaaaaaa;
  (*(code *)(indexes->d).d[0x12].super_QArrayData.alloc)(&local_128);
  if ((undefined1 *)local_128.size == (undefined1 *)0x0) {
    QPixmap::QPixmap((QPixmap *)this);
  }
  else {
    pQVar3 = QWidgetPrivate::windowHandle((QWidgetPrivate *)indexes,Closest);
    if (pQVar3 == (QWindow *)0x0) {
      c = 1.0;
    }
    else {
      c = (qreal)QWindow::devicePixelRatio();
    }
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x10 =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
         &DAT_aaaaaaaaaaaaaaaa;
    _painter = QRect::size(in_RCX);
    local_108.super_QStyleOption._0_8_ = operator*((QSize *)&painter,c);
    QPixmap::QPixmap((QPixmap *)this,(QSize *)&local_108);
    QPixmap::setDevicePixelRatio(c);
    QColor::QColor((QColor *)&local_108,transparent);
    QPixmap::fill((QColor *)this);
    _painter = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&painter,(QPaintDevice *)this);
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)pQVar1 + 0x2f8))(pQVar1,&local_108);
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
    lVar7 = 0;
    for (puVar5 = (undefined1 *)0x0; puVar5 < (ulong)local_128.size; puVar5 = puVar5 + 1) {
      uVar2._0_4_ = in_RCX->x1;
      uVar2._4_4_ = in_RCX->y1;
      local_138 = (QPoint)((ulong)(uint)-(undefined4)uVar2 - (uVar2 & 0xffffffff00000000));
      local_108.super_QStyleOption.rect =
           QRect::translated((QRect *)(CONCAT44(local_128.ptr._4_4_,local_128.ptr._0_4_) + lVar7),
                             &local_138);
      lVar6 = CONCAT44(local_128.ptr._4_4_,local_128.ptr._0_4_) + lVar7 + 0x10;
      (**(code **)&(indexes->d).d[0x13].super_QArrayData)(indexes,&local_108,lVar6);
      plVar4 = (long *)(**(code **)(*(long *)pQVar1 + 0x208))(pQVar1,lVar6);
      (**(code **)(*plVar4 + 0x60))(plVar4,&painter,&local_108,lVar6);
      lVar7 = lVar7 + 0x28;
    }
    QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
    QPainter::~QPainter(&painter);
  }
  QArrayDataPointer<QItemViewPaintPair>::~QArrayDataPointer(&local_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QAbstractItemViewPrivate::renderToPixmap(const QModelIndexList &indexes, QRect *r) const
{
    Q_Q(const QAbstractItemView);
    Q_ASSERT(r);
    QItemViewPaintPairs paintPairs = draggablePaintPairs(indexes, r);
    if (paintPairs.isEmpty())
        return QPixmap();

    QWindow *window = windowHandle(WindowHandleMode::Closest);
    const qreal scale = window ? window->devicePixelRatio() : qreal(1);

    QPixmap pixmap(r->size() * scale);
    pixmap.setDevicePixelRatio(scale);

    pixmap.fill(Qt::transparent);
    QPainter painter(&pixmap);
    QStyleOptionViewItem option;
    q->initViewItemOption(&option);
    option.state |= QStyle::State_Selected;
    for (int j = 0; j < paintPairs.size(); ++j) {
        option.rect = paintPairs.at(j).rect.translated(-r->topLeft());
        const QModelIndex &current = paintPairs.at(j).index;
        adjustViewOptionsForIndex(&option, current);
        q->itemDelegateForIndex(current)->paint(&painter, option, current);
    }
    return pixmap;
}